

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

t_macro * macro_look(int *ip)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int local_54;
  uint local_50;
  int l;
  int hash;
  char c;
  char name [32];
  t_macro *local_20;
  t_macro *ptr;
  int *ip_local;
  
  local_54 = 0;
  local_50 = 0;
  while( true ) {
    cVar1 = prlnbuf[*ip];
    if ((((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) || (cVar1 == ';')) {
      *(undefined1 *)((long)&hash + (long)local_54) = 0;
      local_20 = macro_tbl[(int)(local_50 & 0xff)];
      while ((local_20 != (t_macro *)0x0 &&
             (iVar2 = strcmp((char *)&hash,local_20->name), iVar2 != 0))) {
        local_20 = local_20->next;
      }
      return local_20;
    }
    ppuVar3 = __ctype_b_loc();
    if (((((*ppuVar3)[(int)cVar1] & 8) == 0) && (cVar1 != '_')) && (cVar1 != '.')) break;
    if ((local_54 == 0) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)cVar1] & 0x800) != 0)) {
      return (t_macro *)0x0;
    }
    if (local_54 == 0x1f) {
      return (t_macro *)0x0;
    }
    *(char *)((long)&hash + (long)local_54) = cVar1;
    local_50 = ((int)cVar1 + local_50) * 8 + ((int)((int)cVar1 + local_50) >> 5) + (int)cVar1;
    *ip = *ip + 1;
    local_54 = local_54 + 1;
  }
  return (t_macro *)0x0;
}

Assistant:

struct t_macro *macro_look(int *ip)
{
	struct t_macro *ptr;
	char name[32];
	char c;
	int  hash;
	int  l;

	/* calculate the symbol hash value and check syntax */
	l = 0;
	hash = 0;
	for (;;) {
		c = prlnbuf[*ip];
		if (c == '\0' || c == ' ' || c == '\t' || c == ';')
			break;

		if (!isalnum(c) && c != '_')
		{ if(c!=0x2e) {	return (NULL); }}
		if (l == 0) {
			if (isdigit(c))
				return (NULL);
		}
		if (l == 31)
			return (NULL);
		name[l++] = c;
		hash += c;
		hash  = (hash << 3) + (hash >> 5) + c;
		(*ip)++;
	}
	name[l] = '\0';
	hash &= 0xFF;

	/* browse the hash table */
	ptr = macro_tbl[hash];
	while (ptr) {
		if (!strcmp(name, ptr->name))
			break;
		ptr = ptr->next;
	}

	/* return result */
	return (ptr);
}